

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O1

void __thiscall
slang::ast::Delay3Control::visitExprs<no_legacy_generate::MainVisitor&>
          (Delay3Control *this,AlwaysFFVisitor *visitor)

{
  Expression *pEVar1;
  
  Expression::visitExpression<slang::ast::Expression_const,no_legacy_generate::MainVisitor&>
            (this->expr1,this->expr1,visitor);
  pEVar1 = this->expr2;
  if (pEVar1 != (Expression *)0x0) {
    Expression::visitExpression<slang::ast::Expression_const,no_legacy_generate::MainVisitor&>
              (pEVar1,pEVar1,visitor);
  }
  pEVar1 = this->expr3;
  if (pEVar1 != (Expression *)0x0) {
    Expression::visitExpression<slang::ast::Expression_const,no_legacy_generate::MainVisitor&>
              (pEVar1,pEVar1,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }